

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_clip_bary4(REF_DBL *orig_bary,REF_DBL *bary)

{
  double dVar1;
  double local_b0;
  double local_a0;
  double local_98;
  double local_88;
  double local_80;
  double local_70;
  double local_68;
  double local_58;
  REF_DBL local_50;
  REF_DBL local_48;
  REF_DBL local_40;
  REF_DBL local_38;
  int local_30;
  int local_2c;
  REF_INT largest;
  REF_INT i;
  REF_DBL total;
  REF_DBL *bary_local;
  REF_DBL *orig_bary_local;
  
  if ((ulong)ABS(*orig_bary) < 0x7ff0000000000000) {
    if ((ulong)ABS(orig_bary[1]) < 0x7ff0000000000000) {
      if ((ulong)ABS(orig_bary[2]) < 0x7ff0000000000000) {
        if ((ulong)ABS(orig_bary[3]) < 0x7ff0000000000000) {
          if (0.0 < *orig_bary || *orig_bary == 0.0) {
            local_38 = *orig_bary;
          }
          else {
            local_38 = 0.0;
          }
          *bary = local_38;
          if (0.0 < orig_bary[1] || orig_bary[1] == 0.0) {
            local_40 = orig_bary[1];
          }
          else {
            local_40 = 0.0;
          }
          bary[1] = local_40;
          if (0.0 < orig_bary[2] || orig_bary[2] == 0.0) {
            local_48 = orig_bary[2];
          }
          else {
            local_48 = 0.0;
          }
          bary[2] = local_48;
          if (0.0 < orig_bary[3] || orig_bary[3] == 0.0) {
            local_50 = orig_bary[3];
          }
          else {
            local_50 = 0.0;
          }
          bary[3] = local_50;
          dVar1 = *bary + bary[1] + bary[2] + bary[3];
          if (dVar1 * 1e+20 <= 0.0) {
            local_58 = -(dVar1 * 1e+20);
          }
          else {
            local_58 = dVar1 * 1e+20;
          }
          if (*bary <= 0.0) {
            local_68 = -*bary;
          }
          else {
            local_68 = *bary;
          }
          if (local_68 < local_58) {
            if (dVar1 * 1e+20 <= 0.0) {
              local_70 = -(dVar1 * 1e+20);
            }
            else {
              local_70 = dVar1 * 1e+20;
            }
            if (bary[1] <= 0.0) {
              local_80 = -bary[1];
            }
            else {
              local_80 = bary[1];
            }
            if (local_80 < local_70) {
              if (dVar1 * 1e+20 <= 0.0) {
                local_88 = -(dVar1 * 1e+20);
              }
              else {
                local_88 = dVar1 * 1e+20;
              }
              if (bary[2] <= 0.0) {
                local_98 = -bary[2];
              }
              else {
                local_98 = bary[2];
              }
              if (local_98 < local_88) {
                if (dVar1 * 1e+20 <= 0.0) {
                  local_a0 = -(dVar1 * 1e+20);
                }
                else {
                  local_a0 = dVar1 * 1e+20;
                }
                if (bary[3] <= 0.0) {
                  local_b0 = -bary[3];
                }
                else {
                  local_b0 = bary[3];
                }
                if (local_b0 < local_a0) {
                  *bary = *bary / dVar1;
                  bary[1] = bary[1] / dVar1;
                  bary[2] = bary[2] / dVar1;
                  bary[3] = bary[3] / dVar1;
                  if (*bary < 0.0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0xba7,"ref_node_clip_bary4","bary[0] not positive");
                    return 1;
                  }
                  if (bary[1] < 0.0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0xba8,"ref_node_clip_bary4","bary[1] not positive");
                    return 1;
                  }
                  if (bary[2] < 0.0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0xba9,"ref_node_clip_bary4","bary[2] not positive");
                    return 1;
                  }
                  if (bary[3] < 0.0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0xbaa,"ref_node_clip_bary4","bary[3] not positive");
                    return 1;
                  }
                  if (0x7fefffffffffffff < (ulong)ABS(*bary)) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0xbac,"ref_node_clip_bary4","bary[0] not finite");
                    return 1;
                  }
                  if (0x7fefffffffffffff < (ulong)ABS(bary[1])) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0xbad,"ref_node_clip_bary4","bary[1] not finite");
                    return 1;
                  }
                  if (0x7fefffffffffffff < (ulong)ABS(bary[2])) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0xbae,"ref_node_clip_bary4","bary[2] not finite");
                    return 1;
                  }
                  if (0x7fefffffffffffff < (ulong)ABS(bary[3])) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0xbaf,"ref_node_clip_bary4","bary[3] not finite");
                    return 1;
                  }
                  return 0;
                }
              }
            }
          }
          printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n%.18e %.18e\n",dVar1,*orig_bary
                 ,orig_bary[1],orig_bary[2],orig_bary[3],
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xb98,"ref_node_clip_bary4");
          printf("clipped bary\n%.18e %.18e\n%.18e %.18e\n",*bary,bary[1],bary[2],bary[3]);
          local_30 = 0;
          for (local_2c = 1; local_2c < 4; local_2c = local_2c + 1) {
            if (bary[local_30] <= bary[local_2c] && bary[local_2c] != bary[local_30]) {
              local_30 = local_2c;
            }
          }
          for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
            bary[local_2c] = 0.0;
          }
          bary[local_30] = 1.0;
          printf("modified bary\n%.18e %.18e\n%.18e %.18e\n",*bary,bary[1],bary[2],bary[3]);
          orig_bary_local._4_4_ = 4;
        }
        else {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xb84,"ref_node_clip_bary4","orig_bary[3] not finite");
          orig_bary_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xb83,"ref_node_clip_bary4","orig_bary[2] not finite");
        orig_bary_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xb82,
             "ref_node_clip_bary4","orig_bary[1] not finite");
      orig_bary_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xb81,
           "ref_node_clip_bary4","orig_bary[0] not finite");
    orig_bary_local._4_4_ = 1;
  }
  return orig_bary_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_clip_bary4(REF_DBL *orig_bary, REF_DBL *bary) {
  REF_DBL total;

  RAS(isfinite(orig_bary[0]), "orig_bary[0] not finite");
  RAS(isfinite(orig_bary[1]), "orig_bary[1] not finite");
  RAS(isfinite(orig_bary[2]), "orig_bary[2] not finite");
  RAS(isfinite(orig_bary[3]), "orig_bary[3] not finite");

  bary[0] = MAX(0.0, orig_bary[0]);
  bary[1] = MAX(0.0, orig_bary[1]);
  bary[2] = MAX(0.0, orig_bary[2]);
  bary[3] = MAX(0.0, orig_bary[3]);

  total = bary[0] + bary[1] + bary[2] + bary[3];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total) &&
      ref_math_divisible(bary[3], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
    bary[3] /= total;
  } else {
    REF_INT i, largest;
    printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n%.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, orig_bary[0], orig_bary[1],
           orig_bary[2], orig_bary[3]);
    printf("clipped bary\n%.18e %.18e\n%.18e %.18e\n", bary[0], bary[1],
           bary[2], bary[3]);
    /* chose one node */
    largest = 0;
    for (i = 1; i < 4; i++)
      if (bary[i] > bary[largest]) largest = i;
    for (i = 0; i < 4; i++) bary[i] = 0.0;
    bary[largest] = 1.0;
    printf("modified bary\n%.18e %.18e\n%.18e %.18e\n", bary[0], bary[1],
           bary[2], bary[3]);
    return REF_DIV_ZERO;
  }

  RAS(bary[0] >= 0.0, "bary[0] not positive");
  RAS(bary[1] >= 0.0, "bary[1] not positive");
  RAS(bary[2] >= 0.0, "bary[2] not positive");
  RAS(bary[3] >= 0.0, "bary[3] not positive");

  RAS(isfinite(bary[0]), "bary[0] not finite");
  RAS(isfinite(bary[1]), "bary[1] not finite");
  RAS(isfinite(bary[2]), "bary[2] not finite");
  RAS(isfinite(bary[3]), "bary[3] not finite");

  return REF_SUCCESS;
}